

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

_Bool askfor_aux_keypress(char *buf,size_t buflen,size_t *curs,size_t *len,keypress keypress,
                         _Bool firsttime)

{
  _Bool _Var1;
  size_t sVar2;
  char *s;
  char *local_80;
  char *ocurs_1;
  size_t n_enc;
  char encoded [5];
  char *pcStack_68;
  _Bool atnull;
  char *oshift;
  char *ocurs;
  size_t ulen;
  _Bool firsttime_local;
  size_t *len_local;
  size_t *curs_local;
  size_t buflen_local;
  char *buf_local;
  ui_event_type local_20;
  undefined8 local_18;
  keypress keypress_local;
  
  local_18 = keypress._0_8_;
  local_20 = CONCAT31(local_20._1_3_,keypress.mods);
  keypress_local.type = local_20;
  sVar2 = utf8_strlen(buf);
  if (local_18._4_4_ == 0x81) {
    if (firsttime) {
      *curs = 0;
    }
    else if (*curs != 0) {
      *curs = *curs - 1;
    }
  }
  else if (local_18._4_4_ == 0x82) {
    if (firsttime) {
      *curs = sVar2;
    }
    else if (*curs < sVar2) {
      *curs = *curs + 1;
    }
  }
  else {
    if (local_18._4_4_ == 0x9c) {
      *curs = sVar2;
      return true;
    }
    if (local_18._4_4_ - 0x9e < 2) {
      if (firsttime) {
        *buf = '\0';
        *curs = 0;
        *len = 0;
      }
      else if (((local_18._4_4_ != 0x9f) || (*curs != 0)) &&
              ((local_18._4_4_ != 0x9e || (*curs < sVar2)))) {
        s = utf8_fskip(buf,*curs,(char *)0x0);
        if (s == (char *)0x0) {
          __assert_fail("ocurs",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                        ,0x2d2,
                        "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                       );
        }
        if (local_18._4_4_ == 0x9f) {
          pcStack_68 = utf8_rskip(s,1,buf);
          if (pcStack_68 == (char *)0x0) {
            __assert_fail("oshift",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                          ,0x2d6,
                          "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                         );
          }
          memmove(pcStack_68,s,*len - ((long)s - (long)buf));
          *curs = *curs - 1;
          *len = *len - ((long)s - (long)pcStack_68);
        }
        else {
          pcStack_68 = utf8_fskip(buf + *curs,1,(char *)0x0);
          if (pcStack_68 == (char *)0x0) {
            __assert_fail("oshift",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                          ,0x2de,
                          "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                         );
          }
          memmove(s,pcStack_68,*len - ((long)pcStack_68 - (long)buf));
          *len = *len - ((long)pcStack_68 - (long)s);
        }
        buf[*len] = '\0';
      }
    }
    else {
      if (local_18._4_4_ == 0xe000) {
        *curs = 0;
        return true;
      }
      n_enc._7_1_ = *curs == sVar2;
      ocurs_1 = (char *)0x0;
      _Var1 = keycode_isprint(local_18._4_4_);
      if (_Var1) {
        ocurs_1 = (char *)utf32_to_utf8((char *)((long)&n_enc + 2),5,
                                        (uint32_t *)((long)&local_18 + 4),1,(size_t *)0x0);
      }
      if (ocurs_1 == (char *)0x0) {
        bell();
      }
      else {
        if (firsttime) {
          *buf = '\0';
          *curs = 0;
          *len = 0;
          n_enc._7_1_ = 1;
        }
        if (ocurs_1 + *len < buflen) {
          if ((n_enc._7_1_ & 1) == 0) {
            local_80 = utf8_fskip(buf,*curs,(char *)0x0);
            if (local_80 == (char *)0x0) {
              __assert_fail("ocurs",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-input.c"
                            ,0x30d,
                            "_Bool askfor_aux_keypress(char *, size_t, size_t *, size_t *, struct keypress, _Bool)"
                           );
            }
            memmove(local_80 + (long)ocurs_1,local_80,*len - ((long)local_80 - (long)buf));
          }
          else {
            local_80 = buf + *len;
          }
          memcpy(local_80,(void *)((long)&n_enc + 2),(size_t)ocurs_1);
          *curs = *curs + 1;
          *len = (size_t)(ocurs_1 + *len);
          buf[*len] = '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

bool askfor_aux_keypress(char *buf, size_t buflen, size_t *curs, size_t *len,
						 struct keypress keypress, bool firsttime)
{
	size_t ulen = utf8_strlen(buf);

	switch (keypress.code)
	{
		case ESCAPE:
		{
			*curs = 0;
			return true;
		}
		
		case KC_ENTER:
		{
			*curs = ulen;
			return true;
		}
		
		case ARROW_LEFT:
		{
			if (firsttime) {
				*curs = 0;
			} else if (*curs > 0) {
				(*curs)--;
			}
			break;
		}
		
		case ARROW_RIGHT:
		{
			if (firsttime) {
				*curs = ulen;
			} else if (*curs < ulen) {
				(*curs)++;
			}
			break;
		}
		
		case KC_BACKSPACE:
		case KC_DELETE:
		{
			char *ocurs, *oshift;

			/* If this is the first time round, backspace means "delete all" */
			if (firsttime) {
				buf[0] = '\0';
				*curs = 0;
				*len = 0;
				break;
			}

			/* Refuse to backspace into oblivion */
			if ((keypress.code == KC_BACKSPACE && *curs == 0) ||
				(keypress.code == KC_DELETE && *curs >= ulen))
				break;

			/*
			 * Move the string from k to nul along to the left
			 * by 1.  First, have to get offset corresponding to
			 * the cursor position.
			 */
			ocurs = utf8_fskip(buf, *curs, NULL);
			assert(ocurs);
			if (keypress.code == KC_BACKSPACE) {
				/* Get offset of the previous character. */
				oshift = utf8_rskip(ocurs, 1, buf);
				assert(oshift);
				memmove(oshift, ocurs, *len - (ocurs - buf));
				/* Decrement. */
				(*curs)--;
				*len -= ocurs - oshift;
			} else {
				/* Get offset of the next character. */
				oshift = utf8_fskip(buf + *curs, 1, NULL);
				assert(oshift);
				memmove(ocurs, oshift, *len - (oshift - buf));
				/* Decrement */
				*len -= oshift - ocurs;
			}

			/* Terminate */
			buf[*len] = '\0';

			break;
		}
		
		default:
		{
			bool atnull = (*curs == ulen);
			char encoded[5];
			size_t n_enc = 0;
			char *ocurs;

			if (keycode_isprint(keypress.code)) {
				n_enc = utf32_to_utf8(encoded,
					N_ELEMENTS(encoded), &keypress.code,
					1, NULL);
			}
			if (n_enc == 0) {
				bell();
				break;
			}

			/* Clear the buffer if this is the first time round */
			if (firsttime) {
				buf[0] = '\0';
				*curs = 0;
				*len = 0;
				atnull = 1;
			}

			/* Make sure we have enough room for the new character */
			if (*len + n_enc >= buflen) {
				break;
			}

			/* Insert the encoded character. */
			if (atnull) {
				ocurs = buf + *len;
			} else {
				ocurs = utf8_fskip(buf, *curs, NULL);
				assert(ocurs);
				/*
				 * Move the rest of the buffer along to make
				 * room.
				 */
				memmove(ocurs + n_enc, ocurs,
					*len - (ocurs - buf));
			}
			memcpy(ocurs, encoded, n_enc);

			/* Update position and length. */
			(*curs)++;
			*len += n_enc;

			/* Terminate */
			buf[*len] = '\0';

			break;
		}
	}

	/* By default, we aren't done. */
	return false;
}